

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O3

int ON_ParseLengthExpression
              (wchar_t *str,int str_count,ON_ParseSettings parse_settings,double *length_value,
              ON_ParseSettings *parse_results,LengthUnitSystem *str_length_unit_system)

{
  wchar_t *pwVar1;
  double dVar2;
  ON_ParseSettings OVar3;
  ON_ParseSettings parse_settings_00;
  ON__UINT32 aOVar4 [2];
  ON__UINT32 aOVar5 [2];
  undefined8 uVar6;
  ON__UINT16 OVar7;
  ON__UINT8 OVar8;
  ON__UINT8 OVar9;
  ON__UINT64 OVar10;
  undefined8 uVar11;
  bool bVar12;
  char cVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  undefined7 extraout_var;
  int iVar17;
  int iVar18;
  ON_ParseSettings *pOVar19;
  bool bVar20;
  uint uVar21;
  LengthUnitSystem length_us;
  LengthUnitSystem inches_us;
  double x;
  ON_ParseSettings pr;
  ON_ParseSettings input_parse_settings;
  double inches_value;
  ON_ParseSettings inches_pr;
  ON_ParseSettings parse_inches;
  ON_ParseSettings parse_unit_name_settings;
  LengthUnitSystem local_12a;
  LengthUnitSystem local_129;
  double *local_128;
  LengthUnitSystem *local_120;
  double local_118;
  undefined4 local_10c;
  double local_108;
  ON_ParseSettings *local_100;
  ON_ParseSettings local_f8;
  wchar_t *local_d0;
  ON_ParseSettings local_c8;
  double local_a0;
  ON_ParseSettings local_98;
  ON_ParseSettings local_78;
  ON_ParseSettings local_58;
  
  OVar3 = parse_settings;
  OVar10 = ON_ParseSettings::FalseSettings.m_reserved;
  uVar6 = ON_ParseSettings::FalseSettings._16_8_;
  aOVar5 = ON_ParseSettings::FalseSettings.m_false_default_bits;
  aOVar4 = ON_ParseSettings::FalseSettings.m_true_default_bits;
  local_108 = -1.23432101234321e+308;
  local_12a = None;
  local_c8.m_reserved_bits = parse_settings.m_reserved_bits;
  local_c8.m_context_locale_id = parse_settings.m_context_locale_id;
  local_c8.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
  local_c8.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
  local_c8.m_reserved = parse_settings.m_reserved;
  local_c8.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
  local_c8.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
  local_c8.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
  local_c8.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
  local_f8._16_8_ = ON_ParseSettings::FalseSettings._16_8_;
  local_f8.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  local_f8.m_true_default_bits = ON_ParseSettings::FalseSettings.m_true_default_bits;
  local_f8.m_false_default_bits = ON_ParseSettings::FalseSettings.m_false_default_bits;
  if (length_value != (double *)0x0) {
    *length_value = -1.23432101234321e+308;
  }
  if (str_length_unit_system != (LengthUnitSystem *)0x0) {
    *str_length_unit_system = None;
  }
  uVar11 = ON_ParseSettings::FalseSettings._16_8_;
  if (parse_results != (ON_ParseSettings *)0x0) {
    ON_ParseSettings::FalseSettings.m_reserved_bits = (ON__UINT32)uVar6;
    ON_ParseSettings::FalseSettings.m_context_locale_id = SUB82(uVar6,4);
    OVar7 = ON_ParseSettings::FalseSettings.m_context_locale_id;
    ON_ParseSettings::FalseSettings.m_context_angle_unit_system = SUB81(uVar6,6);
    OVar8 = ON_ParseSettings::FalseSettings.m_context_angle_unit_system;
    ON_ParseSettings::FalseSettings.m_context_length_unit_system = SUB81(uVar6,7);
    OVar9 = ON_ParseSettings::FalseSettings.m_context_length_unit_system;
    parse_results->m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
    ON_ParseSettings::FalseSettings._16_8_ = uVar11;
    parse_results->m_context_locale_id = OVar7;
    parse_results->m_context_angle_unit_system = OVar8;
    parse_results->m_context_length_unit_system = OVar9;
    parse_results->m_reserved = OVar10;
    *&parse_results->m_true_default_bits = aOVar4;
    *&parse_results->m_false_default_bits = aOVar5;
  }
  uVar14 = ON_ParseNumberExpression(str,str_count,OVar3,&local_f8,&local_108);
  if ((int)uVar14 < 1) {
    return 0;
  }
  local_128 = length_value;
  local_120 = str_length_unit_system;
  local_100 = parse_results;
  if (str_count == -1) {
    iVar17 = -1;
    bVar20 = true;
LAB_0056343f:
    bVar12 = ON_ParseSettings::ParseWhiteSpaceBetweenValueAndUnitSystem(&local_c8);
    if (!bVar12) goto LAB_00563472;
    bVar12 = ON_ParseSettings::IsInteriorWhiteSpace(&local_c8,str[uVar14]);
  }
  else {
    iVar17 = str_count - uVar14;
    if (str_count < (int)uVar14) {
      return 0;
    }
    bVar20 = iVar17 == -1;
    if ((int)uVar14 < iVar17 || bVar20) goto LAB_0056343f;
    bVar20 = false;
LAB_00563472:
    bVar12 = false;
  }
  local_58.m_reserved_bits = local_c8.m_reserved_bits;
  local_58.m_context_locale_id = local_c8.m_context_locale_id;
  local_58.m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
  local_58.m_context_length_unit_system = local_c8.m_context_length_unit_system;
  local_58.m_reserved = local_c8.m_reserved;
  local_58.m_true_default_bits[0] = local_c8.m_true_default_bits[0];
  local_58.m_true_default_bits[1] = local_c8.m_true_default_bits[1];
  local_58.m_false_default_bits[0] = local_c8.m_false_default_bits[0];
  local_58.m_false_default_bits[1] = local_c8.m_false_default_bits[1];
  ON_ParseSettings::SetParseLeadingWhiteSpace(&local_58,false);
  ON_ParseSettings::SetParseWhiteSpaceBetweenValueAndUnitSystem(&local_58,bVar12);
  OVar3.m_false_default_bits[0] = local_58.m_false_default_bits[0];
  OVar3.m_false_default_bits[1] = local_58.m_false_default_bits[1];
  OVar3.m_true_default_bits[0] = local_58.m_true_default_bits[0];
  OVar3.m_true_default_bits[1] = local_58.m_true_default_bits[1];
  OVar3.m_reserved_bits = local_58.m_reserved_bits;
  OVar3.m_context_locale_id = local_58.m_context_locale_id;
  OVar3.m_context_angle_unit_system = local_58.m_context_angle_unit_system;
  OVar3.m_context_length_unit_system = local_58.m_context_length_unit_system;
  OVar3.m_reserved = local_58.m_reserved;
  local_d0 = str;
  iVar15 = ON_ParseLengthUnitName(str + uVar14,iVar17,OVar3,&local_12a);
  if (iVar15 < 1) {
    local_12a = None;
    pOVar19 = local_100;
    goto LAB_005635ee;
  }
  iVar18 = -1;
  if ((!bVar20) && (iVar18 = iVar17 - iVar15, iVar17 < iVar15)) {
    return 0;
  }
  uVar14 = iVar15 + uVar14;
  ON_ParseSettings::SetParseWhiteSpaceBetweenValueAndUnitSystem(&local_f8,bVar12);
  pOVar19 = local_100;
  if ((iVar18 != -1 && iVar18 < 1) || (local_12a != Feet)) goto LAB_005635ee;
  local_118 = local_108;
  dVar2 = floor(local_108);
  if ((((dVar2 != local_118) ||
       (((NAN(dVar2) || NAN(local_118) ||
         (bVar20 = ON_ParseSettings::ParseFeetInches(&local_c8), !bVar20)) ||
        (bVar20 = ON_ParseSettings::ParseSignificandDecimalPoint(&local_f8), bVar20)))) ||
      (((bVar20 = ON_ParseSettings::ParseScientificENotation(&local_f8), bVar20 ||
        (bVar20 = ON_ParseSettings::ParseRationalNumber(&local_f8), bVar20)) ||
       (bVar20 = ON_ParseSettings::ParseMultiplication(&local_f8), bVar20)))) ||
     (((bVar20 = ON_ParseSettings::ParseDivision(&local_f8), bVar20 ||
       (bVar20 = ON_ParseSettings::ParsePi(&local_f8), bVar20)) ||
      (bVar20 = ON_ParseSettings::ParseIntegerDashFraction(&local_f8), bVar20)))) goto LAB_005635ee;
  local_78.m_reserved_bits = local_c8.m_reserved_bits;
  local_78.m_context_locale_id = local_c8.m_context_locale_id;
  local_78.m_context_angle_unit_system = local_c8.m_context_angle_unit_system;
  local_78.m_context_length_unit_system = local_c8.m_context_length_unit_system;
  local_78.m_reserved = local_c8.m_reserved;
  local_78.m_true_default_bits[0] = local_c8.m_true_default_bits[0];
  local_78.m_true_default_bits[1] = local_c8.m_true_default_bits[1];
  local_78.m_false_default_bits[0] = local_c8.m_false_default_bits[0];
  local_78.m_false_default_bits[1] = local_c8.m_false_default_bits[1];
  DisableStartAndExpressionParsingStuff(&local_78);
  ON_ParseSettings::SetParsePi(&local_78,false);
  ON_ParseSettings::SetParseFeetInches(&local_78,false);
  local_a0 = -1.23432101234321e+308;
  local_129 = None;
  local_98.m_reserved_bits = ON_ParseSettings::FalseSettings.m_reserved_bits;
  local_98.m_context_locale_id = ON_ParseSettings::FalseSettings.m_context_locale_id;
  local_98.m_context_angle_unit_system = ON_ParseSettings::FalseSettings.m_context_angle_unit_system
  ;
  local_98.m_context_length_unit_system =
       ON_ParseSettings::FalseSettings.m_context_length_unit_system;
  local_98.m_reserved = ON_ParseSettings::FalseSettings.m_reserved;
  local_98.m_true_default_bits[0] = ON_ParseSettings::FalseSettings.m_true_default_bits[0];
  local_98.m_true_default_bits[1] = ON_ParseSettings::FalseSettings.m_true_default_bits[1];
  local_98.m_false_default_bits[0] = ON_ParseSettings::FalseSettings.m_false_default_bits[0];
  local_98.m_false_default_bits[1] = ON_ParseSettings::FalseSettings.m_false_default_bits[1];
  pwVar1 = local_d0 + uVar14;
  local_118 = (double)(ulong)uVar14;
  bVar20 = ON_ParseSettings::IsNumberDash(&local_c8,*pwVar1);
  iVar17 = iVar18;
  if ((bVar20) && (iVar18 == -1 || 2 < iVar18)) {
    cVar13 = ON_ParseSettings::IsDigit(&local_c8,pwVar1[1]);
    iVar17 = iVar18 + -1;
    if (iVar18 == -1) {
      iVar17 = iVar18;
    }
    if (cVar13 == '\0') goto LAB_00563713;
    local_10c = 0;
    uVar16 = 1;
  }
  else {
LAB_00563713:
    if (iVar17 == -1 || 2 < iVar17) {
      if ((((int)local_118._0_4_ < iVar17) || (iVar17 == -1)) &&
         (bVar20 = ON_ParseSettings::ParseWhiteSpaceBetweenFeetAndInches(&local_c8), bVar20)) {
        bVar20 = ON_ParseSettings::IsInteriorWhiteSpace(&local_c8,*pwVar1);
        local_10c = (undefined4)CONCAT71(extraout_var,bVar20);
      }
      else {
        local_10c = 0;
      }
      ON_ParseSettings::SetParseLeadingWhiteSpace(&local_78,SUB41(local_10c,0));
    }
    else {
      local_10c = 0;
    }
    uVar16 = 0;
  }
  parse_settings_00.m_false_default_bits[0] = local_78.m_false_default_bits[0];
  parse_settings_00.m_false_default_bits[1] = local_78.m_false_default_bits[1];
  parse_settings_00.m_true_default_bits[0] = local_78.m_true_default_bits[0];
  parse_settings_00.m_true_default_bits[1] = local_78.m_true_default_bits[1];
  parse_settings_00.m_reserved_bits = local_78.m_reserved_bits;
  parse_settings_00.m_context_locale_id = local_78.m_context_locale_id;
  parse_settings_00.m_context_angle_unit_system = local_78.m_context_angle_unit_system;
  parse_settings_00.m_context_length_unit_system = local_78.m_context_length_unit_system;
  parse_settings_00.m_reserved = local_78.m_reserved;
  iVar17 = ON_ParseLengthExpression
                     (pwVar1 + uVar16,iVar17,parse_settings_00,&local_a0,&local_98,&local_129);
  uVar21 = (uint)((ulong)local_a0 >> 0x20);
  uVar14 = local_118._0_4_;
  if ((local_129 == None && iVar17 != 0) && (0.0 <= local_a0 && local_a0 < 12.0)) {
    if (9 < (uint)(local_d0[local_118._0_4_ + uVar16] + L'\xffffffd0')) goto LAB_005635ee;
    local_129 = Inches;
  }
  if ((local_129 == Inches && iVar17 != 0) && (0.0 <= local_a0 && local_a0 < 12.0)) {
    iVar15 = uVar16 + local_118._0_4_;
    if (0.0 < local_a0 && local_108 < 0.0) {
      uVar21 = uVar21 ^ 0x80000000;
    }
    local_108 = local_108 * 12.0 + (double)CONCAT44(uVar21,SUB84(local_a0,0));
    local_12a = Inches;
    ON_ParseSettings::SetParseFeetInches(&local_f8,true);
    ON_ParseSettings::SetParseLeadingWhiteSpace(&local_98,false);
    ON_ParseSettings::operator|=(&local_f8,&local_98);
    ON_ParseSettings::SetParseWhiteSpaceBetweenFeetAndInches(&local_f8,local_10c._0_1_);
    uVar14 = iVar15 + iVar17;
  }
LAB_005635ee:
  if (local_128 != (double *)0x0) {
    *local_128 = local_108;
  }
  if (pOVar19 != (ON_ParseSettings *)0x0) {
    pOVar19->m_reserved_bits = local_f8.m_reserved_bits;
    pOVar19->m_context_locale_id = local_f8.m_context_locale_id;
    pOVar19->m_context_angle_unit_system = local_f8.m_context_angle_unit_system;
    pOVar19->m_context_length_unit_system = local_f8.m_context_length_unit_system;
    pOVar19->m_reserved = local_f8.m_reserved;
    *&pOVar19->m_true_default_bits = local_f8.m_true_default_bits;
    *&pOVar19->m_false_default_bits = local_f8.m_false_default_bits;
  }
  if (local_120 != (LengthUnitSystem *)0x0) {
    *local_120 = local_12a;
  }
  return uVar14;
}

Assistant:

int ON_ParseLengthExpression( 
  const wchar_t* str,
  int str_count,
  ON_ParseSettings parse_settings,
  double* length_value,
  ON_ParseSettings* parse_results,
  ON::LengthUnitSystem* str_length_unit_system
  )
{
  double x = ON_UNSET_VALUE;
  ON::LengthUnitSystem length_us = ON::LengthUnitSystem::None;
  const ON_ParseSettings input_parse_settings(parse_settings);
  ON_ParseSettings pr = ON_ParseSettings::FalseSettings;
  if ( 0 != length_value )
    *length_value = ON_UNSET_VALUE;
  if ( 0 != str_length_unit_system )
    *str_length_unit_system = length_us;
  if ( 0 != parse_results )
    *parse_results = pr;

  int str_index = ON_ParseNumberExpression(str,str_count,input_parse_settings,&pr,&x);
  if ( str_index <= 0 )
    return 0;

  if ( -1 != str_count )
  {
    if (str_index > str_count )
      return 0;
    str_count -= str_index;
  }

  const bool bParseWhiteSpaceBetweenValueAndUnitSystem
    = (str_index < str_count || -1 == str_count)
    && input_parse_settings.ParseWhiteSpaceBetweenValueAndUnitSystem()
    && input_parse_settings.IsInteriorWhiteSpace(str[str_index]);
  ON_ParseSettings parse_unit_name_settings(input_parse_settings);
  parse_unit_name_settings.SetParseLeadingWhiteSpace(false);
  parse_unit_name_settings.SetParseWhiteSpaceBetweenValueAndUnitSystem(bParseWhiteSpaceBetweenValueAndUnitSystem);
  
  const int end_of_unit_index = ON_ParseLengthUnitName(
    str+str_index,
    str_count,
    parse_unit_name_settings,
    &length_us
  );

  if ( end_of_unit_index > 0 )
  {
    if ( -1 != str_count )
    {
      if (end_of_unit_index > str_count )
        return 0;
      str_count -= end_of_unit_index;
    }
    str_index += end_of_unit_index;

    pr.SetParseWhiteSpaceBetweenValueAndUnitSystem(bParseWhiteSpaceBetweenValueAndUnitSystem);

    if ( -1 == str_count || str_count > 0 )
    {
      if ( ON::LengthUnitSystem::Feet == length_us 
           && floor(x) == x
           && input_parse_settings.ParseFeetInches() 
           && false == pr.ParseSignificandDecimalPoint()
           && false == pr.ParseScientificENotation()
           && false == pr.ParseRationalNumber()
           && false == pr.ParseMultiplication()
           && false == pr.ParseDivision()
           && false == pr.ParsePi()
           && false == pr.ParseIntegerDashFraction()
         )
      {
        // parse inches part or feet and inches
        int inches_index0 = str_index;
        ON_ParseSettings parse_inches = input_parse_settings;
        DisableStartAndExpressionParsingStuff(parse_inches);
        parse_inches.SetParsePi(false);
        parse_inches.SetParseFeetInches(false);

        double inches_value = ON_UNSET_VALUE;
        ON::LengthUnitSystem inches_us = ON::LengthUnitSystem::None;
        ON_ParseSettings inches_pr = ON_ParseSettings::FalseSettings;


        // Dale Lear 9 April 2014 - fix RH-23095 
        //  Checking for a number dash is required to parse 1'-1-1/2" as 13.5 inches.
        int number_dash_count = 0;
        if ( input_parse_settings.IsNumberDash(str[inches_index0]) )
        {
          // It is intentional that the "number dash" between feet and inches
          // cannot have leading or trailing interior space.
          if (-1 == str_count || str_count >= 3)
          {
            if ( input_parse_settings.IsDigit(str[inches_index0 + 1]) )
              number_dash_count = 1;
            if (-1 != str_count)
              str_count--;
          }
        }


        // June 10, 2016 Dale Lear
        // http://mcneel.myjetbrains.com/youtrack/issue/RH-34577
        //  Allow embedded interior white space between the feet and inches.
        //  Example <1' 3"> should parse as 15 inches.
        bool bParseWhiteSpaceBetweenFeetAndInches = false;
        if (0 == number_dash_count)
        {
          if (-1 == str_count || str_count >= 3)
          {
            bParseWhiteSpaceBetweenFeetAndInches
              = (str_index < str_count || -1 == str_count)
              && input_parse_settings.ParseWhiteSpaceBetweenFeetAndInches()
              && input_parse_settings.IsInteriorWhiteSpace(str[inches_index0]);
            parse_inches.SetParseLeadingWhiteSpace(bParseWhiteSpaceBetweenFeetAndInches);
          }
        }

        int end_of_inches_index = ON_ParseLengthExpression(
          str + inches_index0 + number_dash_count,
          str_count,
          parse_inches,&inches_value,&inches_pr,&inches_us);

        if (
          end_of_inches_index > 0
          && ON::LengthUnitSystem::None == inches_us
          && inches_value >= 0.0
          && inches_value < 12.0
          && str[inches_index0 + number_dash_count] >= '0'
          && str[inches_index0 + number_dash_count] <= '9'
          )
        {
          // "lazy" inches format 1'6 is parsed as 1'6"
          inches_us = ON::LengthUnitSystem::Inches;
        }

        if ( end_of_inches_index > 0 
             && ON::LengthUnitSystem::Inches == inches_us
             && inches_value >= 0.0 // Dale Lear: 1'0" parses as 12 inches http://mcneel.myjetbrains.com/youtrack/issue/RH-34577
             && inches_value < 12.0
           )
        {
          // result of correctly adjusting str_count is never used.
          //if ( -1 != str_count)
          //  str_count -= end_of_inches_index;
          str_index = inches_index0 + end_of_inches_index + number_dash_count;
          if ( x < 0.0 && inches_value > 0.0 )
            x = x*12.0 - inches_value;
          else
            x = x*12.0 + inches_value;
          length_us = ON::LengthUnitSystem::Inches;
          pr.SetParseFeetInches(true);
          inches_pr.SetParseLeadingWhiteSpace(false);
          pr |= inches_pr;
          pr.SetParseWhiteSpaceBetweenFeetAndInches(bParseWhiteSpaceBetweenFeetAndInches);
        }
      }
    }
  }
  else
  {
    length_us = ON::LengthUnitSystem::None;
  }

  if ( length_value )
    *length_value = x;
  if ( 0 != parse_results )
    *parse_results = pr;
  if ( 0 != str_length_unit_system )
    *str_length_unit_system = length_us;

  return str_index;
}